

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  Expr *pEVar1;
  char *pcVar2;
  int *in_RSI;
  sqlite3 *in_RDI;
  Expr *pNewExpr;
  Expr *pOldExpr;
  Expr *pPriorSelectColNew;
  Expr *pPriorSelectColOld;
  int i;
  ExprList_item *pOldItem;
  ExprList_item *pItem;
  ExprList *pNew;
  u64 in_stack_ffffffffffffffa0;
  Expr *z;
  sqlite3 *in_stack_ffffffffffffffa8;
  sqlite3 *db_00;
  sqlite3 *db_01;
  Expr *local_48;
  int local_3c;
  int *local_38;
  ExprList_item *local_30;
  ExprList *local_8;
  
  local_48 = (Expr *)0x0;
  db_01 = (sqlite3 *)0x0;
  if (in_RSI == (int *)0x0) {
    local_8 = (ExprList *)0x0;
  }
  else {
    sqlite3DbMallocSize(in_RDI,(void *)0x1d3fc7);
    local_8 = (ExprList *)sqlite3DbMallocRawNN(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if (local_8 == (ExprList *)0x0) {
      local_8 = (ExprList *)0x0;
    }
    else {
      local_8->nExpr = *in_RSI;
      local_8->nAlloc = in_RSI[1];
      local_30 = local_8->a;
      local_38 = in_RSI + 2;
      for (local_3c = 0; local_3c < *in_RSI; local_3c = local_3c + 1) {
        db_00 = *(sqlite3 **)local_38;
        z = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
        pEVar1 = sqlite3ExprDup(db_01,(Expr *)db_00,-0x55555556);
        local_30->pExpr = pEVar1;
        if (((db_00 != (sqlite3 *)0x0) && (*(u8 *)&db_00->pVfs == 0xb2)) &&
           (z = local_30->pExpr, z != (Expr *)0x0)) {
          if (z->pRight == (Expr *)0x0) {
            if ((Expr *)db_00->pDfltColl != local_48) {
              local_48 = (Expr *)db_00->pDfltColl;
              db_01 = (sqlite3 *)sqlite3ExprDup(db_01,(Expr *)db_00,(int)((ulong)z >> 0x20));
              z->pRight = (Expr *)db_01;
            }
            z->pLeft = (Expr *)db_01;
          }
          else {
            local_48 = (Expr *)db_00->mutex;
            db_01 = (sqlite3 *)z->pRight;
            z->pLeft = z->pRight;
          }
        }
        pcVar2 = sqlite3DbStrDup(db_00,(char *)z);
        local_30->zEName = pcVar2;
        local_30->fg = *(anon_struct_4_9_b482b7ef_for_fg *)(local_38 + 4);
        *(ushort *)&(local_30->fg).field_0x1 = *(ushort *)&(local_30->fg).field_0x1 & 0xfffb;
        local_30->u = *(anon_union_4_2_6146edf4_for_u *)(local_38 + 5);
        local_30 = local_30 + 1;
        local_38 = local_38 + 6;
      }
    }
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, const ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem;
  const struct ExprList_item *pOldItem;
  int i;
  Expr *pPriorSelectColOld = 0;
  Expr *pPriorSelectColNew = 0;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sqlite3DbMallocSize(db, p));
  if( pNew==0 ) return 0;
  pNew->nExpr = p->nExpr;
  pNew->nAlloc = p->nAlloc;
  pItem = pNew->a;
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    Expr *pNewExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    if( pOldExpr
     && pOldExpr->op==TK_SELECT_COLUMN
     && (pNewExpr = pItem->pExpr)!=0
    ){
      if( pNewExpr->pRight ){
        pPriorSelectColOld = pOldExpr->pRight;
        pPriorSelectColNew = pNewExpr->pRight;
        pNewExpr->pLeft = pNewExpr->pRight;
      }else{
        if( pOldExpr->pLeft!=pPriorSelectColOld ){
          pPriorSelectColOld = pOldExpr->pLeft;
          pPriorSelectColNew = sqlite3ExprDup(db, pPriorSelectColOld, flags);
          pNewExpr->pRight = pPriorSelectColNew;
        }
        pNewExpr->pLeft = pPriorSelectColNew;
      }
    }
    pItem->zEName = sqlite3DbStrDup(db, pOldItem->zEName);
    pItem->fg = pOldItem->fg;
    pItem->fg.done = 0;
    pItem->u = pOldItem->u;
  }
  return pNew;
}